

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

QLocalSocket * __thiscall QLocalServer::nextPendingConnection(QLocalServer *this)

{
  long lVar1;
  value_type pQVar2;
  
  lVar1 = *(long *)&this->field_0x8;
  if (*(long *)(lVar1 + 0xd0) == 0) {
    pQVar2 = (value_type)0x0;
  }
  else {
    pQVar2 = QList<QLocalSocket_*>::takeFirst((QList<QLocalSocket_*> *)(lVar1 + 0xc0));
    if (*(long *)(lVar1 + 0xd0) <= (long)*(int *)(lVar1 + 0xb8)) {
      QSocketNotifier::setEnabled(SUB81(*(undefined8 *)(lVar1 + 0x80),0));
    }
  }
  return pQVar2;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }